

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::SetState(AActor *this,FState *newstate,bool nofunction)

{
  player_t *ppVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  ushort uVar5;
  undefined8 *puVar6;
  uint uVar7;
  FState *returned_state;
  FStateParamInfo stp;
  FState *local_48;
  FStateParamInfo local_40;
  
  if (((debugfile != (FILE *)0x0) && (ppVar1 = this->player, ppVar1 != (player_t *)0x0)) &&
     ((ppVar1->cheats & 0x2000) != 0)) {
    fprintf((FILE *)debugfile,"for pl %td: SetState while predicting!\n",
            ((long)&ppVar1[-0x3f3e].original_oldbuttons >> 5) * -0x30c30c30c30c30c3);
  }
  if (newstate != (FState *)0x0) {
    do {
      if (this->state == (FState *)0x0) {
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = (uint)this->state->sprite;
      }
      this->state = newstate;
      iVar4 = GetTics(this,newstate);
      this->tics = iVar4;
      (this->renderflags).Value =
           ((byte)newstate->field_0x22 & 1) << 4 | (this->renderflags).Value & 0xffffffef;
      uVar5 = newstate->sprite;
      if (uVar5 != 1) {
        if ((newstate->field_0x22 & 2) == 0) {
          this->frame = newstate->Frame;
        }
        if (uVar5 != 2) {
          if ((((this->flags4).Value & 0x20) == 0) && (uVar5 == this->SpawnState->sprite)) {
            ppVar1 = this->player;
            if (skins == (FPlayerSkin *)0x0 || ppVar1 == (player_t *)0x0) {
              if (uVar7 == uVar5) goto LAB_0054a6b8;
            }
            else {
              puVar2 = (undefined8 *)
                       ((long)&((ppVar1->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                               .Nodes)->Next +
                       (ulong)(((ppVar1->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                .Size - 1 & 0x1ea) * 0x18));
              do {
                puVar6 = puVar2;
                puVar2 = (undefined8 *)*puVar6;
              } while (*(int *)(puVar6 + 1) != 0x1ea);
              uVar5 = (ushort)skins[*(int *)(puVar6[2] + 0x28)].sprite;
            }
          }
          this->sprite = uVar5;
        }
      }
LAB_0054a6b8:
      if (nofunction) {
LAB_0054a70a:
        if (iVar4 != 0) {
          if (Renderer != (FRenderer *)0x0) {
            (*Renderer->_vptr_FRenderer[8])(Renderer,this);
            return true;
          }
          return true;
        }
        newstate = newstate->NextState;
      }
      else {
        local_40.mStateType = STATE_Actor;
        local_40.mPSPIndex = 1;
        local_40.mCallingState = newstate;
        bVar3 = FState::CallAction(newstate,this,this,&local_40,&local_48);
        if (!bVar3) {
LAB_0054a704:
          iVar4 = this->tics;
          goto LAB_0054a70a;
        }
        if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          return false;
        }
        if (local_48 == (FState *)0x0) goto LAB_0054a704;
        this->tics = 0;
        newstate = local_48;
      }
    } while (newstate != (FState *)0x0);
  }
  this->state = (FState *)0x0;
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return false;
}

Assistant:

bool AActor::SetState (FState *newstate, bool nofunction)
{
	if (debugfile && player && (player->cheats & CF_PREDICTING))
		fprintf (debugfile, "for pl %td: SetState while predicting!\n", player-players);
	do
	{
		if (newstate == NULL)
		{
			state = NULL;
			Destroy ();
			return false;
		}
		int prevsprite, newsprite;

		if (state != NULL)
		{
			prevsprite = state->sprite;
		}
		else
		{
			prevsprite = -1;
		}
		state = newstate;
		tics = GetTics(newstate);
		renderflags = (renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (newstate->GetFullbright());
		newsprite = newstate->sprite;
		if (newsprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				frame = newstate->GetFrame();
			}
			if (newsprite != SPR_NOCHANGE)
			{ // okay to change sprite
				if (!(flags4 & MF4_NOSKIN) && newsprite == SpawnState->sprite)
				{ // [RH] If the new sprite is the same as the original sprite, and
				// this actor is attached to a player, use the player's skin's
				// sprite. If a player is not attached, do not change the sprite
				// unless it is different from the previous state's sprite; a
				// player may have been attached, died, and respawned elsewhere,
				// and we do not want to lose the skin on the body. If it wasn't
				// for Dehacked, I would move sprite changing out of the states
				// altogether, since actors rarely change their sprites after
				// spawning.
					if (player != NULL && skins != NULL)
					{
						sprite = skins[player->userinfo.GetSkin()].sprite;
					}
					else if (newsprite != prevsprite)
					{
						sprite = newsprite;
					}
				}
				else
				{
					sprite = newsprite;
				}
			}
		}

		if (!nofunction)
		{
			FState *returned_state;
			FStateParamInfo stp = { newstate, STATE_Actor, PSP_WEAPON };
			if (newstate->CallAction(this, this, &stp, &returned_state))
			{
				// Check whether the called action function resulted in destroying the actor
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return false;
				}
				if (returned_state != NULL)
				{ // The action was an A_Jump-style function that wants to change the next state.
					newstate = returned_state;
					tics = 0;		 // make sure we loop and set the new state properly
					continue;
				}
			}
		}
		newstate = newstate->GetNextState();
	} while (tics == 0);

	if (Renderer != NULL)
	{
		Renderer->StateChanged(this);
	}
	return true;
}